

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O2

void __thiscall Gluco::Solver::reduceDB(Solver *this)

{
  ClauseAllocator *lt;
  bool bVar1;
  uint *puVar2;
  Clause *c;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  vec<unsigned_int> *v;
  long lVar8;
  int iVar9;
  
  this->nbReduceDB = this->nbReduceDB + 1;
  v = &this->learnts;
  lt = &this->ca;
  sort<unsigned_int,reduceDB_lt>(v,(reduceDB_lt)lt);
  puVar2 = RegionAllocator<unsigned_int>::operator[]
                     (&lt->super_RegionAllocator<unsigned_int>,
                      (this->learnts).data[(this->learnts).sz / 2]);
  if ((*puVar2 & 0x7fffff80) == 0) {
    this->nbclausesbeforereduce = this->nbclausesbeforereduce + this->specialIncReduceDB;
  }
  puVar2 = RegionAllocator<unsigned_int>::operator[]
                     (&lt->super_RegionAllocator<unsigned_int>,
                      (this->learnts).data[(long)(this->learnts).sz + -1]);
  if ((*puVar2 & 0x7fffffc0) < 0xc0) {
    this->nbclausesbeforereduce = this->nbclausesbeforereduce + this->specialIncReduceDB;
  }
  iVar4 = (this->learnts).sz;
  uVar7 = (long)iVar4 / 2 & 0xffffffff;
  lVar8 = 0;
  iVar9 = 0;
  do {
    if (iVar4 <= lVar8) {
      vec<unsigned_int>::shrink(v,(int)lVar8 - iVar9);
      checkGarbage(this);
      return;
    }
    c = (Clause *)
        RegionAllocator<unsigned_int>::operator[]
                  (&lt->super_RegionAllocator<unsigned_int>,v->data[lVar8]);
    uVar3 = *(ulong *)&c->header;
    uVar5 = uVar3 & 0x80000000;
    if (((uVar5 == 0) || (((uint)uVar3 & 0x7fffffe0) < 0x41)) || ((int)(uVar3 >> 0x20) < 3)) {
LAB_004b65c4:
      uVar7 = (ulong)((int)uVar7 + (uint)(uVar5 == 0));
      *(ulong *)&c->header = uVar3 | 0x80000000;
      lVar6 = (long)iVar9;
      iVar9 = iVar9 + 1;
      v->data[lVar6] = v->data[lVar8];
    }
    else {
      bVar1 = locked(this,c);
      if ((bVar1) || ((int)uVar7 <= lVar8)) {
        uVar3 = *(ulong *)&c->header;
        uVar5 = (ulong)((uint)uVar3 & 0x80000000);
        goto LAB_004b65c4;
      }
      removeClause(this,(this->learnts).data[lVar8]);
      this->nbRemovedClauses = this->nbRemovedClauses + 1;
    }
    lVar8 = lVar8 + 1;
    iVar4 = (this->learnts).sz;
  } while( true );
}

Assistant:

void Solver::reduceDB()
{ 
  int i, j;
  nbReduceDB++;
  sort(learnts, reduceDB_lt(ca));

  // We have a lot of "good" clauses, it is difficult to compare them. Keep more !
  if(ca[learnts[learnts.size() / RATIOREMOVECLAUSES]].lbd()<=3) nbclausesbeforereduce +=specialIncReduceDB; 
  // Useless :-)
  if(ca[learnts.last()].lbd()<=5)  nbclausesbeforereduce +=specialIncReduceDB;   
  
  // Don't delete binary or locked clauses. From the rest, delete clauses from the first half
  // Keep clauses which seem to be usefull (their lbd was reduce during this sequence)

  int limit = learnts.size() / 2;
  for (i = j = 0; i < learnts.size(); i++){
    Clause& c = ca[learnts[i]];
    if (c.lbd()>2 && c.size() > 2 && c.canBeDel() &&  !locked(c) && (i < limit)) {
      removeClause(learnts[i]);
      nbRemovedClauses++;
    }
    else {
      if(!c.canBeDel()) limit++; //we keep c, so we can delete an other clause
      c.setCanBeDel(true);       // At the next step, c can be delete
      learnts[j++] = learnts[i];
    }
  }
  learnts.shrink(i - j);
  checkGarbage();
}